

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D.c
# Opt level: O2

int Jac(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  void *flagvalue;
  undefined8 *flagvalue_00;
  long lVar5;
  int iVar6;
  double dVar7;
  
  lVar3 = *user_data;
  dVar1 = *(double *)((long)user_data + 0x10);
  dVar2 = *(double *)((long)user_data + 8);
  flagvalue = (void *)N_VGetArrayPointer();
  iVar4 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  iVar6 = 1;
  if (iVar4 == 0) {
    flagvalue_00 = (undefined8 *)N_VGetArrayPointer(Jv);
    iVar4 = check_flag(flagvalue_00,"N_VGetArrayPointer",0);
    if (iVar4 == 0) {
      N_VConst(0,Jv);
      dVar7 = (dVar1 / dVar2) / dVar2;
      *flagvalue_00 = 0;
      for (lVar5 = 1; lVar5 < lVar3 + -1; lVar5 = lVar5 + 1) {
        flagvalue_00[lVar5] =
             *(double *)((long)flagvalue + lVar5 * 8 + 8) * dVar7 +
             *(double *)((long)flagvalue + lVar5 * 8 + -8) * dVar7 +
             *(double *)((long)flagvalue + lVar5 * 8) * (((dVar1 * -2.0) / dVar2) / dVar2);
      }
      flagvalue_00[lVar3 + -1] = 0;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

static int Jac(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y, N_Vector fy,
               void* user_data, N_Vector tmp)
{
  UserData udata = (UserData)user_data; /* variable shortcuts */
  sunindextype N = udata->N;
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *V = NULL, *JV = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  V = N_VGetArrayPointer(v); /* access data arrays */
  if (check_flag((void*)V, "N_VGetArrayPointer", 0)) { return 1; }
  JV = N_VGetArrayPointer(Jv);
  if (check_flag((void*)JV, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, Jv); /* initialize Jv product to zero */

  /* iterate over domain, computing all Jacobian-vector products */
  c1    = k / dx / dx;
  c2    = -SUN_RCONST(2.0) * k / dx / dx;
  JV[0] = 0.0;
  for (i = 1; i < N - 1; i++)
  {
    JV[i] = c1 * V[i - 1] + c2 * V[i] + c1 * V[i + 1];
  }
  JV[N - 1] = 0.0;

  return 0; /* Return with success */
}